

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::DirectStateAccess::Buffers::MapRangeReadBitTest::iterate(MapRangeReadBitTest *this)

{
  GLbitfield GVar1;
  PFNGLNAMEDBUFFERSTORAGE p_Var2;
  PFNGLMAPNAMEDBUFFERRANGE p_Var3;
  PFNGLUNMAPNAMEDBUFFER p_Var4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ContextType ctxType;
  deUint32 dVar8;
  ulong in_RAX;
  undefined4 extraout_var;
  GLuint *pGVar10;
  undefined4 *puVar11;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  byte bVar12;
  long lVar13;
  GLuint buffer;
  undefined8 uStack_38;
  long lVar9;
  
  uStack_38 = in_RAX;
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar7);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar5 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar6 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar5) || (bVar6)) {
    uStack_38 = uStack_38 & 0xffffffff;
    p_Var2 = *(PFNGLNAMEDBUFFERSTORAGE *)(lVar9 + 0xed8);
    this->m_pNamedBufferStorage = p_Var2;
    p_Var3 = *(PFNGLMAPNAMEDBUFFERRANGE *)(lVar9 + 0xd10);
    this->m_pMapNamedBufferRange = p_Var3;
    p_Var4 = *(PFNGLUNMAPNAMEDBUFFER *)(lVar9 + 0x1678);
    this->m_pUnmapNamedBuffer = p_Var4;
    if ((p_Var2 == (PFNGLNAMEDBUFFERSTORAGE)0x0) ||
       ((p_Var3 == (PFNGLMAPNAMEDBUFFERRANGE)0x0 || (p_Var4 == (PFNGLUNMAPNAMEDBUFFER)0x0)))) {
      puVar11 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar11 = 0;
      __cxa_throw(puVar11,&int::typeinfo,0);
    }
    bVar12 = 1;
    lVar13 = 0;
    do {
      (**(code **)(lVar9 + 0x3b8))(1,(long)&uStack_38 + 4);
      dVar8 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar8,"glCreateBuffers failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x6a2);
      GVar1 = *(GLbitfield *)((long)&DAT_01afc67c + lVar13);
      (*this->m_pNamedBufferStorage)(uStack_38._4_4_,0x30,s_reference,GVar1);
      dVar8 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar8,"glNamedBufferData failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x6a6);
      pGVar10 = (GLuint *)(*this->m_pMapNamedBufferRange)(uStack_38._4_4_,0,0x18,GVar1);
      dVar8 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar8,"glMapNamedBufferRange failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x6aa);
      bVar5 = CompareWithReference(this,pGVar10,0,0x18);
      (*this->m_pUnmapNamedBuffer)(uStack_38._4_4_);
      dVar8 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar8,"glUnmapNamedBuffer failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x6b1);
      pGVar10 = (GLuint *)(*this->m_pMapNamedBufferRange)(uStack_38._4_4_,0x18,0x18,GVar1);
      dVar8 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar8,"glMapNamedBufferRange failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x6b6);
      bVar6 = CompareWithReference(this,pGVar10,0x18,0x18);
      (*this->m_pUnmapNamedBuffer)(uStack_38._4_4_);
      dVar8 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar8,"glUnmapNamedBuffer failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x6bd);
      if (uStack_38._4_4_ != 0) {
        (**(code **)(lVar9 + 0x438))(1);
        uStack_38 = uStack_38 & 0xffffffff;
      }
      bVar12 = bVar12 & bVar5 & bVar6;
      lVar13 = lVar13 + 4;
    } while (lVar13 != 0xc);
    if (uStack_38._4_4_ != 0) {
      (**(code **)(lVar9 + 0x438))(1);
      uStack_38 = uStack_38 & 0xffffffff;
    }
    do {
      iVar7 = (**(code **)(lVar9 + 0x800))();
    } while (iVar7 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar12 == 0) {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    else {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult MapRangeReadBitTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	glw::GLuint buffer = 0;

	m_pNamedBufferStorage  = (PFNGLNAMEDBUFFERSTORAGE)gl.namedBufferStorage;
	m_pMapNamedBufferRange = (PFNGLMAPNAMEDBUFFERRANGE)gl.mapNamedBufferRange;
	m_pUnmapNamedBuffer	= (PFNGLUNMAPNAMEDBUFFER)gl.unmapNamedBuffer;

	try
	{
		if ((DE_NULL == m_pNamedBufferStorage) || (DE_NULL == m_pMapNamedBufferRange) ||
			(DE_NULL == m_pUnmapNamedBuffer))
		{
			throw 0;
		}

		glw::GLbitfield access_flags[] = { GL_MAP_READ_BIT, GL_MAP_READ_BIT | GL_MAP_PERSISTENT_BIT,
										   GL_MAP_READ_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT };

		glw::GLuint access_flags_count = sizeof(access_flags) / sizeof(access_flags[0]);

		for (glw::GLuint i = 0; i < access_flags_count; ++i)
		{
			/* Buffer creation. */
			gl.createBuffers(1, &buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

			/* Buffer's storage allocation and reference data upload. */
			m_pNamedBufferStorage(buffer, s_reference_size, s_reference, access_flags[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBufferData failed.");

			/* Mapping with first half of named buffer. */
			glw::GLuint* data = (glw::GLuint*)m_pMapNamedBufferRange(buffer, 0, s_reference_size / 2, access_flags[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBufferRange failed.");

			/* Check with reference. */
			is_ok &= CompareWithReference(data, 0, s_reference_size / 2);

			/* Unmapping with new named buffer unmap function. */
			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");

			/* Mapping with second half of named buffer. */
			data = (glw::GLuint*)m_pMapNamedBufferRange(buffer, s_reference_size / 2, s_reference_size / 2,
														access_flags[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBufferRange failed.");

			/* Check with reference. */
			is_ok &= CompareWithReference(data, s_reference_size / 2, s_reference_size / 2);

			/* Unmapping with new named buffer unmap function. */
			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");

			/* Clean up. */
			if (buffer)
			{
				gl.deleteBuffers(1, &buffer);

				buffer = 0;
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = 0;
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}